

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AppendFeatureOptions
          (cmLocalGenerator *this,string *flags,string *lang,char *feature)

{
  cmMakefile *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  bool bVar1;
  string *psVar2;
  reference pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  string *o;
  iterator __end2;
  iterator __begin2;
  cmList *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  iterator local_88;
  size_type local_80;
  undefined1 local_78 [8];
  cmList options;
  string local_50;
  cmValue local_30;
  cmValue optionList;
  char *feature_local;
  string *lang_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  this_00 = this->Makefile;
  optionList.Value = (string *)feature;
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[18],char_const*&>
            (&local_50,(char (*) [7])0x11240fa,lang,(char (*) [18])"_COMPILE_OPTIONS_",
             (char **)&optionList);
  local_30 = cmMakefile::GetDefinition(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = cmValue::operator_cast_to_bool(&local_30);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_30);
    std::__cxx11::string::string((string *)&local_a8,(string *)psVar2);
    local_88 = &local_a8;
    local_80 = 1;
    init._M_len = 1;
    init._M_array = local_88;
    cmList::cmList((cmList *)local_78,init);
    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88;
    do {
      local_100 = local_100 + -1;
      std::__cxx11::string::~string((string *)local_100);
    } while (local_100 != &local_a8);
    __end2 = cmList::begin_abi_cxx11_((cmList *)local_78);
    o = (string *)cmList::end_abi_cxx11_((cmList *)local_78);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&o), bVar1) {
      pbVar3 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[9])(this,flags,pbVar3);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    cmList::~cmList((cmList *)local_78);
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendFeatureOptions(std::string& flags,
                                            const std::string& lang,
                                            const char* feature)
{
  cmValue optionList = this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", lang, "_COMPILE_OPTIONS_", feature));
  if (optionList) {
    cmList options{ *optionList };
    for (std::string const& o : options) {
      this->AppendFlagEscape(flags, o);
    }
  }
}